

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

string * pbrt::StringPrintf<char*&>(char *fmt,char **args)

{
  string *in_RDI;
  string *ret;
  char **in_stack_000001e0;
  char *in_stack_000001e8;
  string *in_stack_000001f0;
  
  std::__cxx11::string::string((string *)in_RDI);
  detail::stringPrintfRecursive<char*&>(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
  return in_RDI;
}

Assistant:

inline std::string StringPrintf(const char *fmt, Args &&... args) {
    std::string ret;
    detail::stringPrintfRecursive(&ret, fmt, std::forward<Args>(args)...);
    return ret;
}